

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O3

ptr_t __thiscall
aeron::util::MemoryMappedFile::createNew
          (MemoryMappedFile *this,char *filename,off_t offset,size_t size)

{
  char *pcVar1;
  bool bVar2;
  FileHandle fd_00;
  long *plVar3;
  MemoryMappedFile *this_00;
  SourcedException *pSVar4;
  char *pcVar5;
  size_type *psVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *pcVar7;
  ptr_t pVar8;
  FileHandle fd;
  allocator local_b5;
  FileHandle local_b4;
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  fd_00.handle = open64(filename,0x42,0x1b6);
  local_b4.handle = fd_00.handle;
  if (fd_00.handle < 0) {
    pSVar4 = (SourcedException *)__cxa_allocate_exception(0x48);
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"failed to create file: ","")
    ;
    plVar3 = (long *)std::__cxx11::string::append((char *)local_90);
    local_b0._M_dataplus._M_p = (pointer)*plVar3;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar6) {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0.field_2._8_4_ = (undefined4)plVar3[3];
      local_b0.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar6;
    }
    local_b0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "static MemoryMappedFile::ptr_t aeron::util::MemoryMappedFile::createNew(const char *, off_t, size_t)"
               ,"");
    pcVar7 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/util/MemoryMappedFile.cpp"
    ;
    pcVar5 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
    do {
      pcVar5 = pcVar5 + 1;
      pcVar1 = pcVar7 + 1;
      pcVar7 = pcVar7 + 1;
    } while (*pcVar5 == *pcVar1);
    std::__cxx11::string::string((string *)&local_50,pcVar7 + (*pcVar1 == '/'),&local_b5);
    SourcedException::SourcedException(pSVar4,&local_b0,&local_70,&local_50,0x7f);
    *(undefined ***)pSVar4 = &PTR__SourcedException_00163b60;
    __cxa_throw(pSVar4,&IOException::typeinfo,SourcedException::~SourcedException);
  }
  plVar3 = (long *)operator_new(0x10);
  *plVar3 = (long)&PTR__FuncHolder_00163b88;
  plVar3[1] = (long)&local_b4;
  bVar2 = fill(fd_00,size,'\0');
  if (bVar2) {
    this_00 = (MemoryMappedFile *)operator_new(0x10);
    MemoryMappedFile(this_00,local_b4,offset,size);
    this->m_memory = (uint8_t *)this_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<aeron::util::MemoryMappedFile*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->m_memorySize,this_00);
    (**(code **)(*plVar3 + 8))(plVar3);
    pVar8.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    pVar8.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this;
    return (ptr_t)pVar8.
                  super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>;
  }
  pSVar4 = (SourcedException *)__cxa_allocate_exception(0x48);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"failed to write to file: ","")
  ;
  plVar3 = (long *)std::__cxx11::string::append((char *)local_90);
  local_b0._M_dataplus._M_p = (pointer)*plVar3;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar6) {
    local_b0.field_2._M_allocated_capacity = *psVar6;
    local_b0.field_2._8_4_ = (undefined4)plVar3[3];
    local_b0.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar6;
  }
  local_b0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "static MemoryMappedFile::ptr_t aeron::util::MemoryMappedFile::createNew(const char *, off_t, size_t)"
             ,"");
  pcVar7 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/util/MemoryMappedFile.cpp"
  ;
  pcVar5 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
  do {
    pcVar5 = pcVar5 + 1;
    pcVar1 = pcVar7 + 1;
    pcVar7 = pcVar7 + 1;
  } while (*pcVar5 == *pcVar1);
  std::__cxx11::string::string((string *)&local_50,pcVar7 + (*pcVar1 == '/'),&local_b5);
  SourcedException::SourcedException(pSVar4,&local_b0,&local_70,&local_50,0x89);
  *(undefined ***)pSVar4 = &PTR__SourcedException_00163b60;
  __cxa_throw(pSVar4,&IOException::typeinfo,SourcedException::~SourcedException);
}

Assistant:

MemoryMappedFile::ptr_t MemoryMappedFile::createNew(const char *filename, off_t offset, size_t size)
{
    FileHandle fd;
    fd.handle = open(filename, O_RDWR|O_CREAT, 0666);

    if (fd.handle < 0)
    {
        throw IOException(std::string("failed to create file: ") + filename, SOURCEINFO);
    }

    OnScopeExit tidy([&]()
    {
        close(fd.handle);
    });

    if (!fill(fd, size, 0))
    {
        throw IOException(std::string("failed to write to file: ") + filename, SOURCEINFO);
    }

    return MemoryMappedFile::ptr_t(new MemoryMappedFile(fd, offset, size));
}